

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptl.cpp
# Opt level: O1

bool __thiscall
pg::PTLSolver::search_rec(PTLSolver *this,bitset *Region,int vtop,int player,bitset *Subgame)

{
  ulong *puVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  long lVar4;
  Game *pGVar5;
  pointer pcVar6;
  char cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  string **ppsVar10;
  uint uVar11;
  uint uVar12;
  void *__dest;
  ostream *poVar13;
  size_t sVar14;
  long *plVar15;
  ulong uVar16;
  long lVar17;
  size_t *psVar18;
  uint vtop_00;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  int *piVar24;
  int *piVar25;
  ulong uVar26;
  uint *puVar27;
  bitset *this_00;
  uint64_t *puVar28;
  bool bVar29;
  string px;
  bitset Z;
  string __str;
  bitset Y;
  bitset Lower;
  _label_vertex local_130;
  undefined1 local_120 [136];
  string **local_98;
  int *local_90;
  uint64_t *puStack_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  bitset local_68;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (string **)Region->_size;
  piVar25 = (int *)Region->_bitssize;
  puVar28 = (uint64_t *)((long)piVar25 * 8);
  local_90 = piVar25;
  puStack_88 = puVar28;
  __dest = operator_new__(-(ulong)((ulong)piVar25 >> 0x3d != 0) | (ulong)puVar28);
  local_120._128_8_ = __dest;
  if (piVar25 != (int *)0x0) {
    memmove(__dest,Region->_bits,(size_t)puVar28);
  }
  local_120._56_8_ = ((this->super_Solver).game)->n_vertices;
  uVar22 = local_120._56_8_ + 0x3f;
  local_120._64_8_ = uVar22 >> 6;
  puVar28 = (uint64_t *)(local_120._64_8_ << 3);
  local_120._72_8_ = puVar28;
  local_120._48_8_ = operator_new__((ulong)puVar28);
  if (0x3f < uVar22) {
    memset((void *)local_120._48_8_,0,(size_t)puVar28);
  }
  local_68._size = Subgame->_size;
  uVar22 = Subgame->_bitssize;
  __n = uVar22 * 8;
  uVar26 = 0xffffffffffffffff;
  if (uVar22 < 0x2000000000000000) {
    uVar26 = __n;
  }
  local_68._bitssize = uVar22;
  local_68._allocsize = __n;
  local_68._bits = (uint64_t *)operator_new__(uVar26);
  if (uVar22 != 0) {
    memmove(local_68._bits,Subgame->_bits,__n);
  }
  uVar22 = (ulong)vtop;
  local_78 = uVar22 >> 6;
  bVar19 = (byte)vtop & 0x3f;
  local_38 = -2L << bVar19 | 0xfffffffffffffffeU >> 0x40 - bVar19;
  puVar1 = (ulong *)((long)__dest + local_78 * 8);
  *puVar1 = *puVar1 & local_38;
  if (vtop == 0) {
    bVar19 = 0;
  }
  else {
    local_48 = (int *)(1L << (uVar22 & 0x3f));
    local_120._80_8_ = &this->path;
    local_80 = 0;
    local_40 = uVar22;
    do {
      this_00 = (bitset *)(local_120 + 0x30);
      uVar22 = uVar22 - 1;
      uVar16 = uVar22 >> 6;
      uVar26 = *(ulong *)(local_120._128_8_ + uVar16 * 8);
      if ((uVar26 >> (uVar22 & 0x3f) & 1) != 0) {
        local_70 = 1L << (uVar22 & 0x3f);
        uVar23 = ((this->super_Solver).game)->_priority[uVar22];
        local_120._88_8_ = ZEXT48(uVar23);
        vtop_00 = (uint)uVar22;
        if ((uVar23 & 1) == player) {
          puVar1 = (ulong *)(local_120._48_8_ + uVar16 * 8);
          *puVar1 = *puVar1 | local_70;
          this->str[uVar22] = -1;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = vtop_00;
          while( true ) {
            iVar2 = (this->Q).pointer;
            if ((long)iVar2 == 0) break;
            (this->Q).pointer = iVar2 + -1;
            uVar3 = (this->Q).queue[(long)iVar2 + -1];
            attractVertices(this,player,uVar3,(bitset *)(local_120 + 0x80),this_00,&local_68);
            attractTangles(this,player,uVar3,(bitset *)(local_120 + 0x80),this_00,&local_68);
          }
          if (1 < (this->super_Solver).trace) {
            poVar13 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(this->path)._M_dataplus._M_p,(this->path)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"-",1);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)local_120._88_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
            for (sVar14 = bitset::find_first(this_00); sVar14 != 0xffffffffffffffff;
                sVar14 = bitset::find_next(this_00,sVar14)) {
              poVar13 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," \x1b[1;38;5;15m",0xd);
              local_130.g = (this->super_Solver).game;
              local_130.v = (int)sVar14;
              poVar13 = operator<<(poVar13,&local_130);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
              if (this->str[sVar14] != -1) {
                poVar13 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"->",2);
                local_130.g = (this->super_Solver).game;
                local_130.v = this->str[sVar14];
                operator<<(poVar13,&local_130);
              }
            }
            poVar13 = (this->super_Solver).logger;
            cVar7 = (char)poVar13;
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
          pGVar5 = (this->super_Solver).game;
          if ((uint)(((pGVar5->_owner)._bits[uVar16] & local_70) != 0) == player) {
            bVar29 = this->str[uVar22] != -1;
          }
          else {
            uVar23 = pGVar5->_outedges[pGVar5->_firstouts[uVar22]];
            bVar29 = uVar23 == 0xffffffff;
            if (!bVar29) {
              puVar27 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar22] + 1);
              do {
                if (((*(ulong *)(local_120._48_8_ + ((ulong)(long)(int)uVar23 >> 6) * 8) >>
                      ((ulong)uVar23 & 0x3f) & 1) == 0) &&
                   ((local_68._bits[(ulong)(long)(int)uVar23 >> 6] & 1L << ((ulong)uVar23 & 0x3f))
                    != 0)) goto LAB_00172aa0;
                uVar23 = *puVar27;
                puVar27 = puVar27 + 1;
                bVar29 = uVar23 == 0xffffffff;
              } while (!bVar29);
            }
          }
          if (bVar29) {
            memset(this->pea_vidx,0,pGVar5->n_vertices << 2);
            this->pea_curidx = 1;
            bVar29 = extractTangles(this,vtop_00,this_00,this->str);
          }
          else {
LAB_00172aa0:
            local_130.g = (Game *)local_120;
            pcVar6 = (this->path)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar6,pcVar6 + (this->path)._M_string_length);
            uVar20 = (uint)local_120._88_8_;
            uVar23 = -uVar20;
            if (0 < (int)uVar20) {
              uVar23 = uVar20;
            }
            uVar20 = 1;
            if (9 < uVar23) {
              uVar26 = (ulong)uVar23;
              uVar21 = 4;
              do {
                uVar20 = uVar21;
                uVar11 = (uint)uVar26;
                if (uVar11 < 100) {
                  uVar20 = uVar20 - 2;
                  goto LAB_00172e16;
                }
                if (uVar11 < 1000) {
                  uVar20 = uVar20 - 1;
                  goto LAB_00172e16;
                }
                if (uVar11 < 10000) goto LAB_00172e16;
                uVar26 = uVar26 / 10000;
                uVar21 = uVar20 + 4;
              } while (99999 < uVar11);
              uVar20 = uVar20 + 1;
            }
LAB_00172e16:
            uVar26 = (ulong)local_120._88_8_ >> 0x1f & 1;
            local_120._96_8_ = local_120 + 0x70;
            std::__cxx11::string::_M_construct
                      ((ulong)(local_120 + 0x60),(char)uVar20 + (char)uVar26);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)(uVar26 + local_120._96_8_),uVar20,uVar23);
            plVar15 = (long *)std::__cxx11::string::replace
                                        ((ulong)(local_120 + 0x60),0,(char *)0x0,0x17e96f);
            local_120._16_8_ = local_120 + 0x20;
            psVar18 = (size_t *)(plVar15 + 2);
            if ((size_t *)*plVar15 == psVar18) {
              local_120._32_8_ = *psVar18;
              local_120._40_8_ = plVar15[3];
            }
            else {
              local_120._32_8_ = *psVar18;
              local_120._16_8_ = (size_t *)*plVar15;
            }
            local_120._24_8_ = plVar15[1];
            *plVar15 = (long)psVar18;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_120._80_8_,local_120._16_8_);
            if ((undefined1 *)local_120._16_8_ != local_120 + 0x20) {
              operator_delete((void *)local_120._16_8_,local_120._32_8_ + 1);
            }
            if ((undefined1 *)local_120._96_8_ != local_120 + 0x70) {
              operator_delete((void *)local_120._96_8_,
                              (ulong)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                              local_120._112_8_)->_M_impl).super__Vector_impl_data.
                                             _M_start + 1));
            }
            bVar29 = search_rec(this,this_00,vtop_00,player,&local_68);
            std::__cxx11::string::_M_assign((string *)local_120._80_8_);
            if (local_130.g != (Game *)local_120) {
              operator_delete(local_130.g,local_120._0_8_ + 1);
            }
          }
          if (local_90 != (int *)0x0) {
            piVar25 = (int *)0x0;
            do {
              puVar1 = (ulong *)(local_120._128_8_ + (long)piVar25 * 8);
              *puVar1 = *puVar1 & ~*(ulong *)(local_120._48_8_ + (long)piVar25 * 8);
              piVar25 = (int *)((long)piVar25 + 1);
            } while (local_90 != piVar25);
          }
          if (local_68._bitssize != 0) {
            uVar26 = 0;
            do {
              local_68._bits[uVar26] =
                   local_68._bits[uVar26] & ~*(ulong *)(local_120._48_8_ + uVar26 * 8);
              uVar26 = uVar26 + 1;
            } while (local_68._bitssize != uVar26);
          }
        }
        else {
          *(ulong *)(local_120._128_8_ + uVar16 * 8) = ~local_70 & uVar26;
          puVar1 = (ulong *)(local_120._48_8_ + local_78 * 8);
          *puVar1 = *puVar1 | (ulong)local_48;
          this->str[local_40] = -1;
          iVar2 = (this->Q).pointer;
          (this->Q).pointer = iVar2 + 1;
          (this->Q).queue[iVar2] = (uint)local_40;
          while( true ) {
            puVar28 = puStack_88;
            piVar25 = local_90;
            ppsVar10 = local_98;
            uVar9 = local_120._128_8_;
            uVar8 = local_120._48_8_;
            iVar2 = (this->Q).pointer;
            if ((long)iVar2 == 0) break;
            (this->Q).pointer = iVar2 + -1;
            uVar3 = (this->Q).queue[(long)iVar2 + -1];
            attractVertices(this,player,uVar3,(bitset *)(local_120 + 0x80),this_00,&local_68);
            attractTangles(this,player,uVar3,(bitset *)(local_120 + 0x80),this_00,&local_68);
          }
          local_98 = (string **)local_120._56_8_;
          local_120._56_8_ = ppsVar10;
          local_90 = (int *)local_120._64_8_;
          puStack_88 = (uint64_t *)local_120._72_8_;
          local_120._64_8_ = piVar25;
          local_120._72_8_ = puVar28;
          local_120._128_8_ = local_120._48_8_;
          local_120._48_8_ = uVar9;
          puVar1 = (ulong *)(uVar8 + local_78 * 8);
          *puVar1 = *puVar1 & local_38;
          if (piVar25 != (int *)0x0) {
            piVar24 = (int *)0x0;
            do {
              puVar1 = (ulong *)(uVar9 + (long)piVar24 * 8);
              *puVar1 = *puVar1 & ~*(ulong *)(uVar8 + (long)piVar24 * 8);
              piVar24 = (int *)((long)piVar24 + 1);
            } while (piVar25 != piVar24);
          }
          puVar1 = (ulong *)(uVar9 + uVar16 * 8);
          *puVar1 = *puVar1 | local_70;
          if (1 < (this->super_Solver).trace) {
            poVar13 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar13,"\x1b[1;33mregion\x1b[m \x1b[1;36m",0x18);
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar13,(this->path)._M_dataplus._M_p,(this->path)._M_string_length
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"-",1);
            poVar13 = (ostream *)std::ostream::operator<<(poVar13,(int)local_120._88_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
            sVar14 = 0xffffffffffffffff;
            if ((int *)local_120._64_8_ != (int *)0x0) {
              lVar17 = local_120._64_8_ * -0x40;
              piVar25 = (int *)local_120._64_8_;
              do {
                lVar17 = lVar17 + 0x40;
                lVar4 = *(long *)(local_120._48_8_ + ((long)piVar25 - 1U) * 8);
                if (lVar4 != 0) {
                  sVar14 = LZCOUNT(lVar4) - lVar17 ^ 0x3f;
                  break;
                }
                piVar25 = (int *)((long)piVar25 - 1);
              } while (piVar25 != (int *)0x0);
            }
            for (; sVar14 != 0xffffffffffffffff; sVar14 = bitset::find_prev(this_00,sVar14)) {
              poVar13 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar13," \x1b[1;38;5;15m",0xd);
              local_130.g = (this->super_Solver).game;
              local_130.v = (int)sVar14;
              poVar13 = operator<<(poVar13,&local_130);
              std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\x1b[m",3);
              uVar26 = (ulong)this->str[sVar14];
              if ((uVar26 != 0xffffffffffffffff) &&
                 ((*(ulong *)(local_120._48_8_ + (uVar26 >> 6) * 8) >> (uVar26 & 0x3f) & 1) != 0)) {
                poVar13 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar13,"->",2);
                local_130.g = (this->super_Solver).game;
                local_130.v = this->str[sVar14];
                operator<<(poVar13,&local_130);
              }
            }
            poVar13 = (this->super_Solver).logger;
            cVar7 = (char)poVar13;
            std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + cVar7);
            std::ostream::put(cVar7);
            std::ostream::flush();
          }
          local_130.g = (Game *)local_120;
          pcVar6 = (this->path)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar6,pcVar6 + (this->path)._M_string_length);
          uVar20 = (uint)local_120._88_8_;
          uVar23 = -uVar20;
          if (0 < (int)uVar20) {
            uVar23 = uVar20;
          }
          uVar21 = 1;
          if (9 < uVar23) {
            uVar26 = (ulong)uVar23;
            uVar11 = 4;
            do {
              uVar21 = uVar11;
              uVar12 = (uint)uVar26;
              if (uVar12 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_00172cc5;
              }
              if (uVar12 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_00172cc5;
              }
              if (uVar12 < 10000) goto LAB_00172cc5;
              uVar26 = uVar26 / 10000;
              uVar11 = uVar21 + 4;
            } while (99999 < uVar12);
            uVar21 = uVar21 + 1;
          }
LAB_00172cc5:
          local_120._96_8_ = local_120 + 0x70;
          std::__cxx11::string::_M_construct
                    ((ulong)(local_120 + 0x60),(char)uVar21 - (SUB81(local_120._88_8_,3) >> 7));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)(uVar20 >> 0x1f) + local_120._96_8_),uVar21,uVar23);
          plVar15 = (long *)std::__cxx11::string::replace
                                      ((ulong)(local_120 + 0x60),0,(char *)0x0,0x17e96f);
          local_120._16_8_ = local_120 + 0x20;
          psVar18 = (size_t *)(plVar15 + 2);
          if ((size_t *)*plVar15 == psVar18) {
            local_120._32_8_ = *psVar18;
            local_120._40_8_ = plVar15[3];
          }
          else {
            local_120._32_8_ = *psVar18;
            local_120._16_8_ = (size_t *)*plVar15;
          }
          local_120._24_8_ = plVar15[1];
          *plVar15 = (long)psVar18;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_120._80_8_,local_120._16_8_);
          if ((undefined1 *)local_120._16_8_ != local_120 + 0x20) {
            operator_delete((void *)local_120._16_8_,local_120._32_8_ + 1);
          }
          if ((undefined1 *)local_120._96_8_ != local_120 + 0x70) {
            operator_delete((void *)local_120._96_8_,
                            (ulong)((long)&(((_Vector_base<int,_std::allocator<int>_> *)
                                            local_120._112_8_)->_M_impl).super__Vector_impl_data.
                                           _M_start + 1));
          }
          bVar29 = search_rec(this,(bitset *)(local_120 + 0x30),vtop_00,player,&local_68);
          std::__cxx11::string::_M_assign((string *)local_120._80_8_);
          if (local_130.g != (Game *)local_120) {
            operator_delete(local_130.g,local_120._0_8_ + 1);
          }
        }
        local_80 = CONCAT71((int7)(local_80 >> 8),(byte)local_80 | bVar29);
        if ((int *)local_120._64_8_ != (int *)0x0) {
          memset((void *)local_120._48_8_,0,local_120._64_8_ << 3);
        }
      }
    } while (uVar22 != 0);
    bVar19 = (byte)local_80;
  }
  if (local_68._bits != (uint64_t *)0x0) {
    operator_delete__(local_68._bits);
  }
  if ((void *)local_120._48_8_ != (void *)0x0) {
    operator_delete__((void *)local_120._48_8_);
  }
  if ((void *)local_120._128_8_ != (void *)0x0) {
    operator_delete__((void *)local_120._128_8_);
  }
  return (bool)(bVar19 & 1);
}

Assistant:

bool
PTLSolver::search_rec(bitset &Region, int vtop, int player, bitset &Subgame)
{
    bool changes = false; // whether we found tangles/dominions

    bitset Y(Region); // the remaining subgame of <R>
    bitset Z(nodecount()); // move me
    bitset Lower(Subgame);

#if 0 /**/
    // First, attract to the open "exit" for the opponent
    // That is, remove Attr(top) from <Y>.

    Z[vtop] = true; // add to <Z>
    str[vtop] = -1;
    Q.push(vtop);

    while (Q.nonempty()) {
        const int v = Q.pop();
        attractVertices(1-player, v, Y, Z, Y);
        if (multiplayer) attractTangles(1-player, v, Y, Z, Y);
    }

    Y -= Z;
    Z.reset();
#else
    Y[vtop] = false; // ensure <vtop> is never attracted...
    // Lower[vtop] = false; // and that 
#endif

    /////////////////
    // After each iteration:
    // <Y> and <Lower> are updated, removing subregions
    // if top is "good": attract to Z, remove from <Y> and <Lower>
    // if <Z> is a "bad" ... ..
    /////////////////

    for (int top=vtop-1; top!=-1; top--) {
        // find next top below <vtop> in Y
        if (!Y[top]) continue;

        /*
        logger << "Contents of Y:";
        for (auto v = Y.find_first(); v != bitset::npos; v = Y.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        logger << "Contents of Lower:";
        for (auto v = Lower.find_first(); v != bitset::npos; v = Lower.find_next(v)) logger << " " << label_vertex(v);
        logger << std::endl;
        */

        const int pr = priority(top);
        const int pl = priority(top)&1;

        if (pl == player) {
            Z[top] = true; // add to <Z>
            str[top] = -1;
            Q.push(top);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            /**
             * Now Z is the lowest region, <top> the top vertex
             */

            bool closed_region = true;

            /**
             * Lowest region, check if closed.
             */

            if (owner(top) == player) {
                if (str[top] == -1) closed_region = false;
            } else {
                for (auto curedge = outs(top); *curedge != -1; curedge++) {
                    if (!Z[*curedge] and Lower[*curedge]) {
                        closed_region = false;
                        break;
                    }
                }
            }

            if (closed_region) {
                /**
                 * Extract tangles by computing SCCs starting at each top vertex.
                 * Note: each bottom SCC must contain a head vertex.
                 */

                memset(pea_vidx, 0, sizeof(int[nodecount()]));
                pea_curidx = 1;
                changes |= extractTangles(top, Z, str);
            } else {
                /**
                 * Not a closed region, go recursive.
                 */

                std::string px = path;
                path += "-" + std::to_string(pr);
                changes |= search_rec(Z, top, player, Lower);
                path = px;
            }

            Y -= Z;
            Lower -= Z;
        } else {
            // Now recompute the region: reattract to <vtop>,
            // but not via higher (already removed) regions or via the bad vertex <top>

            // Y := remaining region except <top>
            // Lower := remaining region plus remaining lower game

            Y[top] = false; // remove <top> from consideration

            // logger << "Contents of Y2:";
            // for (auto v = Y2.find_first(); v != bitset::npos; v = Y2.find_next(v)) logger << " " << label_vertex(v);
            // logger << std::endl;

            Z[vtop] = true; // add to <Z>
            str[vtop] = -1;
            Q.push(vtop);

            while (Q.nonempty()) {
                const int v = Q.pop();
                attractVertices(player, v, Y, Z, Lower);
                attractTangles(player, v, Y, Z, Lower);
            }

            // Now Z is everything that can go to <vtop> avoiding <top>
            // And Y\Z is everything that must go via <top>

            // Set Y := everything to <vtop> not via <top>
            // Set Z := everything only to <vtop> via <top>

            Y.swap(Z);
            Y[vtop] = false; // but remove <vtop> again
            Z -= Y;
            Z[top] = true;

#ifndef NDEBUG
            if (trace >= 2) {
                // report region
                logger << "\033[1;33mregion\033[m \033[1;36m" << path << "-" << pr << "\033[m";
                for (auto v = Z.find_last(); v != bitset::npos; v = Z.find_prev(v)) {
                    logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
                    if (str[v] != -1 and Z[str[v]]) logger << "->" << label_vertex(str[v]);
                }
                logger << std::endl;
            }
#endif

            std::string px = path;
            path += "-" + std::to_string(pr);
            changes |= search_rec(Z, top, player, Lower);
            path = px;
        }

        Z.reset();
    }

    return changes;
}